

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDSimulationDataGenerator.cpp
# Opt level: O2

void __thiscall
SWDSimulationDataGenerator::OutputWriteBit(SWDSimulationDataGenerator *this,BitState state)

{
  SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mSWDIO);
  AdvanceAllBySec(this,3e-07);
  SimulationChannelDescriptor::Transition();
  AdvanceAllBySec(this,4e-07);
  SimulationChannelDescriptor::Transition();
  AdvanceAllBySec(this,3e-07);
  return;
}

Assistant:

void SWDSimulationDataGenerator::OutputWriteBit( BitState state )
{
    mSWDIO->TransitionIfNeeded( state );

    AdvanceAllBySec( TENTH_US * 3 );

    mSWCLK->Transition(); // CLK goes high
    AdvanceAllBySec( TENTH_US * 4 );
    mSWCLK->Transition(); // CLK goes low

    AdvanceAllBySec( TENTH_US * 3 );
}